

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* mocker::findRedundantNodes
            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             *__return_storage_ptr__,shared_ptr<mocker::ast::ASTNode> *ast,
            unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
            *exprType,
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *pureFunc)

{
  element_type *peVar1;
  FindRedundantNodes local_90;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  peVar1 = (ast->super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_90.unusedVars._M_h._M_buckets = &local_90.unusedVars._M_h._M_single_bucket;
  local_90.super_ConstVisitor.super_VisitorBase<true,_true>._vptr_VisitorBase =
       (VisitorBase<true,_true>)&PTR_operator___001f1fc8;
  local_90.hasSideEffect = false;
  local_90.unusedVars._M_h._M_bucket_count = 1;
  local_90.unusedVars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90.unusedVars._M_h._M_element_count = 0;
  local_90.unusedVars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_90.unusedVars._M_h._M_rehash_policy._M_next_resize = 0;
  local_90.unusedVars._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_90.identifier._M_dataplus._M_p = (pointer)&local_90.identifier.field_2;
  local_90.identifier._M_string_length = 0;
  local_90.identifier.field_2._M_local_buf[0] = '\0';
  local_90.res = __return_storage_ptr__;
  local_90.exprType = exprType;
  local_90.pureFunc = pureFunc;
  (*peVar1->_vptr_ASTNode[3])(peVar1,&local_90);
  anon_unknown_5::FindRedundantNodes::~FindRedundantNodes(&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<ast::NodeID> findRedundantNodes(
    const std::shared_ptr<ast::ASTNode> &ast,
    const std::unordered_map<ast::NodeID, std::shared_ptr<ast::Type>> &exprType,
    const std::unordered_set<std::string> &pureFunc) {
  std::unordered_set<ast::NodeID> res;
  ast->accept(FindRedundantNodes{res, exprType, pureFunc});
  return res;
}